

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytevector.c
# Opt level: O1

sexp_conflict
utf32_2_str(sexp_conflict ctx,char *bv,int len,sexp_conflict endianness,int endianness_mandatory)

{
  uint uVar1;
  ulong uVar2;
  sexp_conflict psVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  uchar *p;
  bool bVar9;
  
  bVar9 = (((ctx->value).type.setters)->value).type.slots != endianness;
  if (3 < len && endianness_mandatory == 0) {
    uVar7 = 4;
    if (*(int *)bv == -0x20000) {
      bVar9 = true;
      goto LAB_0010274f;
    }
    if (*(int *)bv == 0xfeff) goto LAB_0010274f;
  }
  uVar7 = 0;
LAB_0010274f:
  lVar8 = (long)len;
  uVar2 = uVar7 | 3;
  lVar4 = 1;
  if ((long)uVar2 < lVar8) {
    lVar4 = 0;
    do {
      uVar6 = *(uint *)(bv + (uVar2 - 3));
      uVar1 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
      if (!bVar9) {
        uVar1 = uVar6;
      }
      lVar5 = 1;
      if ((0x7f < (int)uVar1) && (lVar5 = 2, 0x7ff < (int)uVar1)) {
        lVar5 = (ulong)(0xffff < (int)uVar1) + 3;
      }
      lVar4 = lVar4 + lVar5;
      uVar2 = uVar2 + 4;
    } while ((long)uVar2 < lVar8);
    lVar4 = lVar4 * 2 + 1;
  }
  psVar3 = (sexp_conflict)sexp_make_string_op(ctx,0,2,lVar4,0x43e);
  if ((((ulong)psVar3 & 3) == 0 && psVar3 != (sexp_conflict)0x0) &&
     ((long)(uVar7 | 3) < lVar8 && psVar3->tag == 9)) {
    p = (uchar *)((((psVar3->value).type.cpl)->value).flonum_bits +
                 (long)(((psVar3->value).type.name)->value).flonum_bits);
    lVar4 = uVar7 + 3;
    do {
      uVar6 = *(uint *)(bv + lVar4 + -3);
      uVar1 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
      if (!bVar9) {
        uVar1 = uVar6;
      }
      uVar6 = 1;
      if ((0x7f < (int)uVar1) && (uVar6 = 2, 0x7ff < (int)uVar1)) {
        uVar6 = (0xffff < (int)uVar1) + 3;
      }
      utf8_encode_char(p,uVar6,uVar1);
      p = p + uVar6;
      lVar4 = lVar4 + 4;
    } while (lVar4 < lVar8);
  }
  return psVar3;
}

Assistant:

sexp utf32_2_str(sexp ctx, char* bv, int len, sexp endianness, int endianness_mandatory) {
  int swap = endianness != sexp_global(ctx, SEXP_G_ENDIANNESS);
  uint32_t ch;
  sexp_sint_t i, ch_len, utf8_len=0, start=0;
  sexp res;
  unsigned char* dst;
  if (!endianness_mandatory && len>3) {
    ch = *(uint32_t*)(bv);
    if (ch == 0xFFFE0000) {
      swap = 1;
      start = 4;
    } else if (ch == 0xFEFF) {
      start = 4;
    }
  }
  for (i=start; i+3<len; i+=4) {
    ch = swap ? sexp_swap_u32(*((uint32_t*)(bv+i))) : *((uint32_t*)(bv+i));
    utf8_len += utf8_char_byte_count(ch);
  }
  res = sexp_make_string(ctx, sexp_make_fixnum(utf8_len), SEXP_VOID);
  if (!(res && sexp_stringp(res))) return res;
  dst = (unsigned char*) sexp_string_data(res);
  for (i=start; i+3<len; i+=4) {
    ch = swap ? sexp_swap_u32(*((uint32_t*)(bv+i))) : *((uint32_t*)(bv+i));
    ch_len = utf8_char_byte_count(ch);
    utf8_encode_char(dst, ch_len, ch);
    dst += ch_len;
  }
  return res;
}